

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadAsciiFile(COBImporter *this,Scene *out,StreamReaderLE *stream)

{
  bool bVar1;
  undefined1 local_68 [8];
  LineSplitter splitter;
  ChunkInfo ci;
  StreamReaderLE *stream_local;
  Scene *out_local;
  COBImporter *this_local;
  
  COB::ChunkInfo::ChunkInfo((ChunkInfo *)&splitter.mSwallow);
  LineSplitter::LineSplitter((LineSplitter *)local_68,stream,true,true);
  while (bVar1 = LineSplitter::operator_cast_to_bool((LineSplitter *)local_68), bVar1) {
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"PolH ");
    if (bVar1) {
      ReadChunkInfo_Ascii(this,(ChunkInfo *)&splitter.mSwallow,(LineSplitter *)local_68);
      ReadPolH_Ascii(this,out,(LineSplitter *)local_68,(ChunkInfo *)&splitter.mSwallow);
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"BitM ");
    if (bVar1) {
      ReadChunkInfo_Ascii(this,(ChunkInfo *)&splitter.mSwallow,(LineSplitter *)local_68);
      ReadBitM_Ascii(this,out,(LineSplitter *)local_68,(ChunkInfo *)&splitter.mSwallow);
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"Mat1 ");
    if (bVar1) {
      ReadChunkInfo_Ascii(this,(ChunkInfo *)&splitter.mSwallow,(LineSplitter *)local_68);
      ReadMat1_Ascii(this,out,(LineSplitter *)local_68,(ChunkInfo *)&splitter.mSwallow);
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"Grou ");
    if (bVar1) {
      ReadChunkInfo_Ascii(this,(ChunkInfo *)&splitter.mSwallow,(LineSplitter *)local_68);
      ReadGrou_Ascii(this,out,(LineSplitter *)local_68,(ChunkInfo *)&splitter.mSwallow);
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"Lght ");
    if (bVar1) {
      ReadChunkInfo_Ascii(this,(ChunkInfo *)&splitter.mSwallow,(LineSplitter *)local_68);
      ReadLght_Ascii(this,out,(LineSplitter *)local_68,(ChunkInfo *)&splitter.mSwallow);
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"Came ");
    if (bVar1) {
      ReadChunkInfo_Ascii(this,(ChunkInfo *)&splitter.mSwallow,(LineSplitter *)local_68);
      ReadCame_Ascii(this,out,(LineSplitter *)local_68,(ChunkInfo *)&splitter.mSwallow);
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"Bone ");
    if (bVar1) {
      ReadChunkInfo_Ascii(this,(ChunkInfo *)&splitter.mSwallow,(LineSplitter *)local_68);
      ReadBone_Ascii(this,out,(LineSplitter *)local_68,(ChunkInfo *)&splitter.mSwallow);
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"Chan ");
    if (bVar1) {
      ReadChunkInfo_Ascii(this,(ChunkInfo *)&splitter.mSwallow,(LineSplitter *)local_68);
      ReadChan_Ascii(this,out,(LineSplitter *)local_68,(ChunkInfo *)&splitter.mSwallow);
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"Unit ");
    if (bVar1) {
      ReadChunkInfo_Ascii(this,(ChunkInfo *)&splitter.mSwallow,(LineSplitter *)local_68);
      ReadUnit_Ascii(this,out,(LineSplitter *)local_68,(ChunkInfo *)&splitter.mSwallow);
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)local_68,"END ");
    if (bVar1) break;
    LineSplitter::operator++((LineSplitter *)local_68);
  }
  LineSplitter::~LineSplitter((LineSplitter *)local_68);
  return;
}

Assistant:

void COBImporter::ReadAsciiFile(Scene& out, StreamReaderLE* stream)
{
    ChunkInfo ci;
    for(LineSplitter splitter(*stream);splitter;++splitter) {

        // add all chunks to be recognized here. /else ../ omitted intentionally.
        if (splitter.match_start("PolH ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadPolH_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("BitM ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadBitM_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Mat1 ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadMat1_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Grou ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadGrou_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Lght ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadLght_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Came ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadCame_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Bone ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadBone_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Chan ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadChan_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Unit ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadUnit_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("END ")) {
            // we don't need this, but I guess there is a reason this
            // chunk has been implemented into COB for.
            return;
        }
    }
}